

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O0

void __thiscall Assimp::COB::Node::Node(Node *this,Type type)

{
  Type type_local;
  Node *this_local;
  
  ChunkInfo::ChunkInfo(&this->super_ChunkInfo);
  this->_vptr_Node = (_func_int **)&PTR__Node_00f418e8;
  this->type = type;
  std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::deque
            (&this->temp_children);
  std::__cxx11::string::string((string *)&this->name);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->transform);
  this->unit_scale = 1.0;
  return;
}

Assistant:

Node(Type type) : type(type), unit_scale(1.f){}